

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-3-implicit-types.cpp
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::parseImplicitTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes)

{
  __node_base_ptr *this;
  Index *pIVar1;
  pointer pHVar2;
  pointer pAVar3;
  Index *pIVar4;
  ulong uVar5;
  undefined1 local_158 [8];
  ParseImplicitTypeDefsCtx ctx;
  Result<wasm::Ok> _val;
  undefined1 local_68 [8];
  WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> with;
  
  ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
            ((ParseImplicitTypeDefsCtx *)local_158,input,types,implicitTypes,typeIndices);
  pIVar4 = (decls->implicitTypeDefs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (decls->implicitTypeDefs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = &ctx.sigTypes._M_h._M_single_bucket;
  with.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)decls;
  do {
    pAVar3 = with.annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pIVar4 == pIVar1) {
      uVar5 = 0;
      while( true ) {
        pHVar2 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(types->
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3) <= uVar5)
        break;
        local_68 = (undefined1  [8])pHVar2[uVar5].id;
        with.ctx._0_4_ = (int)uVar5;
        std::
        _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                  ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)(pAVar3[2].contents._M_str + 0x1c8),local_68);
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
LAB_00c36777:
      ParseImplicitTypeDefsCtx::~ParseImplicitTypeDefsCtx((ParseImplicitTypeDefsCtx *)local_158);
      return __return_storage_ptr__;
    }
    WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::WithPosition
              ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)local_68,
               (ParseImplicitTypeDefsCtx *)local_158,*pIVar4);
    typeuse<wasm::WATParser::ParseImplicitTypeDefsCtx>
              ((Result<wasm::Ok> *)this,(ParseImplicitTypeDefsCtx *)local_158,true);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                 (string *)&ctx.sigTypes._M_h._M_single_bucket);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&ctx.sigTypes._M_h._M_single_bucket
                );
      WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
                ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)local_68);
      goto LAB_00c36777;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)this);
    WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
              ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)local_68);
    pIVar4 = pIVar4 + 1;
  } while( true );
}

Assistant:

Result<>
parseImplicitTypeDefs(ParseDeclsCtx& decls,
                      Lexer& input,
                      IndexMap& typeIndices,
                      std::vector<HeapType>& types,
                      std::unordered_map<Index, HeapType>& implicitTypes) {
  ParseImplicitTypeDefsCtx ctx(input, types, implicitTypes, typeIndices);
  for (Index pos : decls.implicitTypeDefs) {
    WithPosition with(ctx, pos);
    CHECK_ERR(typeuse(ctx));
  }
  // Record type indices now that all the types have been parsed.
  for (Index i = 0; i < types.size(); ++i) {
    decls.wasm.typeIndices.insert({types[i], i});
  }
  return Ok{};
}